

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void lts2::BinaryReconstructionWithBIHT
               (Mat *X,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float sparsityCoeff,
               Size *patchSize,float patchMean,int norm,string *wavelet)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  _InputArray *p_Var5;
  ostream *poVar6;
  undefined8 uVar7;
  int iVar8;
  Size SVar9;
  long lVar10;
  long lVar11;
  int wh;
  int ww;
  int fsize;
  double *Q;
  double *P;
  float local_2b4;
  _InputArray local_2b0;
  int local_294;
  Mat *local_290;
  int local_288;
  float local_284;
  _OutputArray local_280;
  _InputArray local_268;
  undefined8 uStack_250;
  int local_1fc;
  double local_1f8;
  double local_1f0;
  Mat Ax;
  undefined8 local_1e0;
  Size local_1d8;
  ulong *local_1a8;
  long *local_1a0;
  SignOperator A;
  Mat X_im;
  undefined4 uStack_174;
  Size local_168;
  undefined8 uStack_160;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  Mat nablaJ;
  Mat C0;
  
  local_294 = norm;
  local_290 = binaryDescriptor;
  local_288 = iterations;
  local_284 = patchMean;
  if ((norm != 2) && (norm != 4)) {
LAB_00109066:
    _X_im = &local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&X_im,"norm == cv::NORM_L1 || norm == cv::NORM_L2","");
    uVar7 = cv::error(-0xd7,(string *)&X_im,"BinaryReconstructionWithBIHT",
                      "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                      ,0x167);
    SignOperator::~SignOperator(&A);
    cv::Mat::~Mat(&C0);
    cv::Mat::~Mat(&nablaJ);
    cv::Mat::~Mat(&Ax);
    cv::Mat::~Mat(&X_im);
    _Unwind_Resume(uVar7);
  }
  iVar8 = *(int *)(binaryDescriptor + 0xc);
  if (*(int *)(binaryDescriptor + 0xc) < *(int *)(binaryDescriptor + 8)) {
    iVar8 = *(int *)(binaryDescriptor + 8);
  }
  dVar4 = 1.0;
  if ((double)sparsityCoeff <= 1.0) {
    dVar4 = (double)sparsityCoeff;
  }
  iVar1 = patchSize->width;
  iVar2 = patchSize->height;
  local_2b4 = rintf((float)(iVar2 * iVar1) * (float)(double)(~-(ulong)(dVar4 <= 0.0) & (ulong)dVar4)
                   );
  local_100 = iVar1;
  local_fc = iVar2;
  cv::Mat::create(X,&local_100,5);
  local_1e0 = &X_im;
  local_168.width = 0;
  local_168.height = 0;
  uStack_160 = 0;
  _X_im = 0;
  uStack_174 = 0;
  _Ax = 0xc1020006;
  local_1d8 = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)X,(_InputArray *)&Ax);
  cv::Mat::Mat(&X_im);
  cv::Mat::Mat(&Ax);
  cv::Mat::Mat(&nablaJ);
  P = (double *)0x0;
  Q = (double *)0x0;
  fsize = 0;
  WaveletCoef(wavelet,&P,&Q,&fsize);
  local_108 = patchSize->width;
  local_104 = patchSize->height;
  cv::Mat::create(&X_im,&local_108,5);
  _C0 = (double)local_284;
  local_268.obj = &C0;
  local_268.flags = -0x3efdfffa;
  local_268.sz = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&X_im,&local_268);
  WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
  local_2b0.flags = 0;
  local_2b0._4_4_ = 0;
  cv::Mat::Mat((Mat *)&local_268,X,(Rect_ *)&local_2b0);
  cv::Mat::clone();
  cv::Mat::~Mat((Mat *)&local_268);
  InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
  SignOperator::SignOperator(&A);
  local_110 = patchSize->width;
  local_10c = patchSize->height;
  cv::Mat::create(X,&local_110,5);
  local_268.sz.width = 0;
  local_268.sz.height = 0;
  uStack_250 = 0;
  local_268.flags = 0;
  local_268._4_4_ = 0;
  local_268.obj = (Mat *)0x0;
  local_2b0.flags = -0x3efdfffa;
  local_2b0.sz = (Size)&DAT_400000001;
  local_2b0.obj = (Mat *)&local_268;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)X,&local_2b0);
  if (local_294 == 4) {
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,local_290,&X_im);
    WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
    local_268.sz.width = 0;
    local_268.sz.height = 0;
    local_268.flags = 0x1010000;
    local_268.obj = X;
    p_Var5 = (_InputArray *)cv::noArray();
    dVar4 = (double)cv::norm(&local_268,4,p_Var5);
    if (0.0 < (float)dVar4) {
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x2010000;
      local_268.obj = X;
      cv::Mat::convertTo((_OutputArray *)X,(int)&local_268,1.0 / (double)(float)dVar4,0.0);
    }
  }
  local_1fc = (int)local_2b4;
  local_1f8 = (double)(1.0 / (float)iVar8);
  local_1f0 = local_1f8 * 0.5;
  local_2b4 = (float)1;
  if (1 < local_288) {
    local_2b4 = (float)local_288;
  }
  iVar8 = 0;
  do {
    InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[2])(LBD,&X_im,&Ax);
    if (local_294 == 2) {
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x1010000;
      local_280.super__InputArray.obj = &Ax;
      local_2b0.sz.width = 0;
      local_2b0.sz.height = 0;
      local_2b0.flags = 0x1010000;
      local_2b0.obj = local_290;
      local_280.super__InputArray.sz.width = 0;
      local_280.super__InputArray.sz.height = 0;
      local_280.super__InputArray.flags = -0x3dff0000;
      local_268.obj = local_280.super__InputArray.obj;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::subtract(&local_268,&local_2b0,&local_280,p_Var5,-1);
      (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,&Ax,&X_im);
      WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x2010000;
      local_268.obj = &nablaJ;
      cv::Mat::convertTo((_OutputArray *)&nablaJ,(int)&local_268,local_1f0,0.0);
    }
    else {
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x1010000;
      local_280.super__InputArray.obj = &Ax;
      local_2b0.sz.width = 0;
      local_2b0.sz.height = 0;
      local_2b0.flags = 0x1010000;
      local_2b0.obj = local_290;
      local_280.super__InputArray.sz.width = 0;
      local_280.super__InputArray.sz.height = 0;
      local_280.super__InputArray.flags = 0x2010000;
      local_268.obj = local_280.super__InputArray.obj;
      cv::multiply(&local_268,&local_2b0,&local_280,1.0,-1);
      if ((_Ax & 0xfff) != 5) {
        local_268._0_8_ = &local_268.sz;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"src.type() == CV_32F","");
        cv::error(-0xd7,(string *)&local_268,"ExtractTheNegativePart",
                  "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                  ,0x67);
        goto LAB_00109066;
      }
      local_268._0_8_ = *local_1a8 << 0x20 | *local_1a8 >> 0x20;
      cv::Mat::create(&Ax,&local_268);
      iVar1 = (int)local_1e0;
      if ((_Ax >> 0xe & 1) != 0) {
        local_1e0 = (Mat *)CONCAT44(local_1e0._4_4_ * (int)local_1e0 * (int)local_1e0,1);
      }
      if (0 < (long)(int)local_1e0) {
        lVar3 = *local_1a0;
        lVar10 = 0;
        SVar9 = local_1d8;
        do {
          if (0 < local_1e0._4_4_) {
            lVar11 = 0;
            do {
              *(uint *)((long)SVar9 + lVar11 * 4) =
                   -(uint)(*(float *)((long)SVar9 + lVar11 * 4) < 0.0) & 0xbf800000;
              lVar11 = lVar11 + 1;
            } while (local_1e0._4_4_ != (int)lVar11);
          }
          lVar10 = lVar10 + 1;
          SVar9 = (Size)((long)SVar9 + lVar3);
        } while (lVar10 != (int)local_1e0);
      }
      if ((_Ax >> 0xe & 1) != 0) {
        local_1e0 = (Mat *)CONCAT44((int)((long)((ulong)(uint)((int)((long)local_1e0._4_4_ /
                                                                    (long)iVar1) >> 0x1f) << 0x20 |
                                                (long)local_1e0._4_4_ / (long)iVar1 & 0xffffffffU) /
                                         (long)iVar1),iVar1);
      }
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x1010000;
      local_2b0.sz.width = 0;
      local_2b0.sz.height = 0;
      local_2b0.flags = 0x1010000;
      local_2b0.obj = local_290;
      local_280.super__InputArray.sz.width = 0;
      local_280.super__InputArray.sz.height = 0;
      local_280.super__InputArray.flags = 0x2010000;
      local_280.super__InputArray.obj = &Ax;
      local_268.obj = &Ax;
      cv::multiply(&local_268,&local_2b0,&local_280,1.0,-1);
      (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,&Ax,&X_im);
      WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x2010000;
      local_268.obj = &nablaJ;
      cv::Mat::convertTo((_OutputArray *)&nablaJ,(int)&local_268,local_1f8,0.0);
    }
    local_2b0.obj = &nablaJ;
    local_268.sz.width = 0;
    local_268.sz.height = 0;
    local_268.flags = 0x1010000;
    local_2b0.sz.width = 0;
    local_2b0.sz.height = 0;
    local_2b0.flags = 0x1010000;
    local_280.super__InputArray.sz.width = 0;
    local_280.super__InputArray.sz.height = 0;
    local_280.super__InputArray.flags = -0x3dff0000;
    local_280.super__InputArray.obj = X;
    local_268.obj = X;
    p_Var5 = (_InputArray *)cv::noArray();
    cv::subtract(&local_268,&local_2b0,&local_280,p_Var5,-1);
    ProxL0(X,local_1fc);
    InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
    ProxRangeConstraint(&X_im,0.0,1.0);
    ProxMeanConstraint(&X_im,local_284);
    iVar8 = iVar8 + 1;
    if ((float)iVar8 == local_2b4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stopped after ",0xe)
      ;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_2b4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," iterations ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (max allowed was ",0x12);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x1010000;
      local_268.obj = X;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::norm(&local_268,4,p_Var5);
      InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
      local_268.sz.width = 0;
      local_268.sz.height = 0;
      local_268.flags = 0x1010000;
      local_2b0.sz.width = 0;
      local_2b0.sz.height = 0;
      local_2b0.flags = 0x3010000;
      local_2b0.obj = X;
      local_268.obj = &X_im;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::normalize(&local_268,(_InputOutputArray *)&local_2b0,0.0,1.0,0x20,-1,p_Var5);
      if (P != (double *)0x0) {
        operator_delete__(P);
      }
      if (Q != (double *)0x0) {
        operator_delete__(Q);
      }
      SignOperator::~SignOperator(&A);
      cv::Mat::~Mat(&C0);
      cv::Mat::~Mat(&nablaJ);
      cv::Mat::~Mat(&Ax);
      cv::Mat::~Mat(&X_im);
      return;
    }
  } while( true );
}

Assistant:

void lts2::BinaryReconstructionWithBIHT(cv::Mat &X, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                        int iterations, float sparsityCoeff, cv::Size patchSize, float patchMean,
                                        int norm, std::string const &wavelet)
{
  CV_Assert(norm == cv::NORM_L1 || norm == cv::NORM_L2);

  int const M = MAX(binaryDescriptor.rows, binaryDescriptor.cols);
  float const tau = 1.0 / (float)M;

  sparsityCoeff = MAX(MIN(sparsityCoeff, 1.0), 0.0);
  int const K = (int)rintf( sparsityCoeff*patchSize.area() );

  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));

  cv::Mat X_im;
  cv::Mat Ax;
  cv::Mat nablaJ;

  // Wavelet basis
  double *P = NULL, *Q = NULL;
  int fsize = 0, ww, wh;
  lts2::WaveletCoef(wavelet, &P, &Q, &fsize);

  X_im.create(patchSize, CV_32F);
  X_im.setTo(cv::Scalar(patchMean));
  lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
  cv::Mat C0 = X(cv::Rect(0,0,ww,wh)).clone();
  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);

  // Operators
  SignOperator A;

  // Special init if norm = L2
  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));
  if (norm == cv::NORM_L2)
  {
    LBD.ApplyConjugate(binaryDescriptor, X_im);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
    float norm_x = cv::norm(X);
    if (norm_x > 0.0) X /= norm_x;
  }

  bool hasConverged = false;
  int iter = 0;

  while (!hasConverged)
  {
    // Back from the wavelet world
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    LBD.Apply(X_im, Ax);

    // Step 1a : gradient
    if (norm == cv::NORM_L1)
    {
      Ax -= binaryDescriptor;

      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);
      nablaJ *= (0.5*tau);
    }
    else
    {
      cv::multiply(Ax, binaryDescriptor, Ax);
      ExtractTheNegativePart(Ax, Ax);

      cv::multiply(Ax, binaryDescriptor, Ax);
      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);

      nablaJ *= tau;
    }

    // Step 1b : update estimate
    X -= nablaJ;

    // Step 2 : enforce sparsity
    lts2::ProxL0(X, K);
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    lts2::ProxRangeConstraint(X_im, 0.0, 1.0);
    lts2::ProxMeanConstraint(X_im, patchMean);

    // Termination criterion
    hasConverged = (++iter >= iterations);  // Iterations count limit
  }

#ifdef DEBUG
  std::cout << "Stopped after " << iter << " iterations " << " (max allowed was " << iterations << ")" << std::endl;
#endif

  // Normalize by projecting to the sphere
  float norm_x = cv::norm(X);
//  if (norm_x < LTS2_EPSILON)
//    norm_x = 1.0
//  X /= norm_x;

  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
  cv::normalize(X_im, X, 0.0, 1.0, cv::NORM_MINMAX);

  // Cleanup
  delete[] P;
  delete[] Q;
}